

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O2

bool __thiscall
database::ComparableString::operator<(ComparableString *this,ComparableString *string)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  string local_48;
  
  _ToLowerCase(&local_48,this,&this->m_string);
  _Var2._M_p = local_48._M_dataplus._M_p;
  std::__cxx11::string::~string((string *)&local_48);
  sVar1 = (this->m_string)._M_string_length;
  _ToLowerCase(&local_48,this,&string->m_string);
  std::__cxx11::string::~string((string *)&local_48);
  bVar3 = std::
          __lexicographical_compare_impl<char_const*,char_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (_Var2._M_p,_Var2._M_p + sVar1,local_48._M_dataplus._M_p,
                     local_48._M_dataplus._M_p + (string->m_string)._M_string_length);
  return bVar3;
}

Assistant:

inline bool operator < (const database::ComparableString& string) const
    {
      const char* lhs = _ToLowerCase(this -> m_string).c_str();
      std::size_t lhs_length = this -> m_string.length();
      const char* rhs = _ToLowerCase(string.m_string).c_str();
      std::size_t rhs_length = string.m_string.length();
      if(std::lexicographical_compare(lhs,lhs + lhs_length,rhs,rhs + rhs_length))
        return true;
      else
        return false;
    }